

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

idx_t duckdb::TemplatedMatch<true,float,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  bool bVar2;
  const_reference pvVar3;
  idx_t iVar4;
  SelectionVector *pSVar5;
  idx_t i_1;
  idx_t iVar6;
  ValidityMask *lhs_validity;
  idx_t i;
  idx_t iVar7;
  float local_94;
  idx_t local_90;
  uint local_84;
  data_ptr_t local_80;
  value_type local_78;
  ulong local_70;
  data_ptr_t local_68;
  SelectionVector *local_60;
  idx_t local_58;
  ValidityBytes rhs_mask;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  local_60 = (lhs_format->unified).sel;
  local_80 = (lhs_format->unified).data;
  local_68 = rhs_row_locations->data;
  local_58 = count;
  pvVar3 = vector<unsigned_long,_true>::get<true>(&rhs_layout->offsets,col_idx);
  local_70 = col_idx >> 3;
  local_84 = 1 << ((byte)col_idx & 7);
  local_78 = *pvVar3;
  if (puVar1 == (unsigned_long *)0x0) {
    local_90 = 0;
    for (iVar7 = 0; local_58 != iVar7; iVar7 = iVar7 + 1) {
      iVar6 = iVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)sel->sel_vector[iVar7];
      }
      iVar4 = iVar6;
      if (local_60->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)local_60->sel_vector[iVar6];
      }
      rhs_mask.validity_mask = *(uchar **)(local_68 + iVar6 * 8);
      rhs_mask.capacity =
           ((long)(rhs_layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(rhs_layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_94 = *(float *)(rhs_mask.validity_mask + local_78);
      if ((local_84 & rhs_mask.validity_mask[local_70]) == 0) {
LAB_01914dd9:
        iVar4 = *no_match_count;
        *no_match_count = iVar4 + 1;
        pSVar5 = no_match_sel;
      }
      else {
        bVar2 = GreaterThan::Operation<float>(&local_94,(float *)(local_80 + iVar4 * 4));
        if (!bVar2) goto LAB_01914dd9;
        iVar4 = local_90;
        pSVar5 = sel;
        local_90 = local_90 + 1;
      }
      pSVar5->sel_vector[iVar4] = (sel_t)iVar6;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhs_mask.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  else {
    local_90 = 0;
    for (iVar7 = 0; local_58 != iVar7; iVar7 = iVar7 + 1) {
      iVar6 = iVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)sel->sel_vector[iVar7];
      }
      iVar4 = iVar6;
      if (local_60->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)local_60->sel_vector[iVar6];
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>,
                         iVar4);
      rhs_mask.validity_mask = *(uchar **)(local_68 + iVar6 * 8);
      rhs_mask.capacity =
           ((long)(rhs_layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(rhs_layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_94 = *(float *)(rhs_mask.validity_mask + local_78);
      if ((bVar2) && ((rhs_mask.validity_mask[local_70] & local_84) != 0)) {
        bVar2 = GreaterThan::Operation<float>(&local_94,(float *)(local_80 + iVar4 * 4));
        if (!bVar2) goto LAB_01914cf1;
        iVar4 = local_90;
        pSVar5 = sel;
        local_90 = local_90 + 1;
      }
      else {
LAB_01914cf1:
        iVar4 = *no_match_count;
        *no_match_count = iVar4 + 1;
        pSVar5 = no_match_sel;
      }
      pSVar5->sel_vector[iVar4] = (sel_t)iVar6;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhs_mask.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  return local_90;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}